

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O3

void __thiscall
duckdb::DecimalToString::FormatDecimal<duckdb::hugeint_t>
          (DecimalToString *this,hugeint_t value,uint8_t width,uint8_t scale,char *dst,idx_t len)

{
  hugeint_t value_00;
  DecimalToString *pDVar1;
  char *pcVar2;
  OutOfRangeException *this_00;
  ulong uVar3;
  undefined7 in_register_00000081;
  char *__s;
  char *ptr;
  hugeint_t lhs;
  hugeint_t value_01;
  hugeint_t minor;
  string local_50;
  
  uVar3 = value.lower;
  pDVar1 = this;
  if ((long)uVar3 < 0) {
    if (uVar3 == 0x8000000000000000 && this == (DecimalToString *)0x0) {
      this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Negation of HUGEINT is out of range!","");
      OutOfRangeException::OutOfRangeException(this_00,&local_50);
      __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pDVar1 = (DecimalToString *)-(long)this;
    uVar3 = ~uVar3 + (ulong)(this == (DecimalToString *)0x0);
    *(undefined1 *)CONCAT71(in_register_00000081,scale) = 0x2d;
  }
  value_01.upper = uVar3;
  value_01.lower = (uint64_t)pDVar1;
  ptr = (undefined1 *)CONCAT71(in_register_00000081,scale) + (long)dst;
  if (width != '\0') {
    lhs.upper = uVar3;
    lhs.lower = (uint64_t)pDVar1;
    value_01 = Hugeint::DivMod(lhs,*(hugeint_t *)(Hugeint::POWERS_OF_TEN + (ulong)width * 0x10),
                               (hugeint_t *)&local_50);
    value_00.upper = local_50._M_string_length;
    value_00.lower = (uint64_t)local_50._M_dataplus._M_p;
    pcVar2 = NumericHelper::FormatUnsigned<duckdb::hugeint_t>(value_00,ptr);
    __s = ptr + -(ulong)width;
    if (__s < pcVar2) {
      switchD_012e3010::default(__s,0x30,(size_t)(pcVar2 + ((ulong)width - (long)ptr)));
      pcVar2 = __s;
    }
    pcVar2[-1] = '.';
    if ((byte)value.upper <= width) {
      return;
    }
    ptr = pcVar2 + -1;
  }
  NumericHelper::FormatUnsigned<duckdb::hugeint_t>(value_01,ptr);
  return;
}

Assistant:

void DecimalToString::FormatDecimal(hugeint_t value, uint8_t width, uint8_t scale, char *dst, idx_t len) {
	auto endptr = dst + len;

	int negative = value.upper < 0;
	if (negative) {
		Hugeint::NegateInPlace(value);
		*dst = '-';
		dst++;
	}
	if (scale == 0) {
		// with scale=0 we format the number as a regular number
		NumericHelper::FormatUnsigned(value, endptr);
		return;
	}

	// we write two numbers:
	// the numbers BEFORE the decimal (major)
	// and the numbers AFTER the decimal (minor)
	hugeint_t minor;
	hugeint_t major = Hugeint::DivMod(value, Hugeint::POWERS_OF_TEN[scale], minor);

	// write the number after the decimal
	dst = NumericHelper::FormatUnsigned(minor, endptr);
	// (optionally) pad with zeros and add the decimal point
	while (dst > (endptr - scale)) {
		*--dst = '0';
	}
	*--dst = '.';
	// now write the part before the decimal
	D_ASSERT(width > scale || major == 0);
	if (width > scale) {
		dst = NumericHelper::FormatUnsigned(major, dst);
	}
}